

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

SUNErrCode N_VConstVectorArray_Serial(int nvec,sunrealtype c,N_Vector *Z)

{
  long lVar1;
  long lVar2;
  undefined8 *in_RSI;
  int in_EDI;
  sunrealtype in_XMM0_Qa;
  sunrealtype *zd;
  sunindextype N;
  sunindextype j;
  int i;
  SUNContext_conflict sunctx_local_scope_;
  long local_30;
  int local_24;
  
  if (in_EDI == 1) {
    N_VConst_Serial(in_XMM0_Qa,(N_Vector)*in_RSI);
  }
  else {
    lVar1 = **(long **)*in_RSI;
    for (local_24 = 0; local_24 < in_EDI; local_24 = local_24 + 1) {
      lVar2 = *(long *)(*(long *)in_RSI[local_24] + 0x10);
      for (local_30 = 0; local_30 < lVar1; local_30 = local_30 + 1) {
        *(sunrealtype *)(lVar2 + local_30 * 8) = in_XMM0_Qa;
      }
    }
  }
  return 0;
}

Assistant:

SUNErrCode N_VConstVectorArray_Serial(int nvec, sunrealtype c, N_Vector* Z)
{
  SUNFunctionBegin(Z[0]->sunctx);
  int i;
  sunindextype j, N;
  sunrealtype* zd = NULL;

  /* invalid number of vectors */
  SUNAssert(nvec >= 1, SUN_ERR_ARG_OUTOFRANGE);

  /* should have called N_VConst */
  if (nvec == 1)
  {
    N_VConst_Serial(c, Z[0]);
    SUNCheckLastErr();
    return SUN_SUCCESS;
  }

  /* get vector length */
  N = NV_LENGTH_S(Z[0]);

  /* set each vector in the vector array to a constant */
  for (i = 0; i < nvec; i++)
  {
    zd = NV_DATA_S(Z[i]);
    for (j = 0; j < N; j++) { zd[j] = c; }
  }

  return SUN_SUCCESS;
}